

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

int Bac_ManClpObjNum(Bac_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Bac_Ntk_t *p_00;
  long lVar4;
  long lVar5;
  
  iVar1 = p->nNtks;
  lVar5 = 0xe8;
  for (lVar4 = 1; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
    *(undefined4 *)((long)&p->pNtks->pDesign + lVar5) = 0xffffffff;
    lVar5 = lVar5 + 0xd0;
  }
  p_00 = Bac_ManRoot(p);
  iVar1 = (p_00->vOutputs).nSize;
  iVar2 = (p_00->vInputs).nSize;
  iVar3 = Bac_ManClpObjNum_rec(p_00);
  return iVar3 + iVar1 + iVar2;
}

Assistant:

int Bac_ManClpObjNum( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        pNtk->Count = -1;
    return Bac_NtkPioNum( Bac_ManRoot(p) ) + Bac_ManClpObjNum_rec( Bac_ManRoot(p) );
}